

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void lyht_free(ly_ht *ht,_func_void_void_ptr *val_free)

{
  uchar *puVar1;
  ly_ht_hlist *plVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (ht != (ly_ht *)0x0) {
    if (val_free != (_func_void_void_ptr *)0x0) {
      for (uVar4 = 0; uVar4 < ht->size; uVar4 = uVar4 + 1) {
        plVar2 = ht->hlists + uVar4;
        while (plVar2->first != 0xffffffff) {
          puVar1 = ht->recs;
          uVar3 = (ulong)(plVar2->first * (uint)ht->rec_size);
          (*val_free)(puVar1 + uVar3 + 8);
          plVar2 = (ly_ht_hlist *)(puVar1 + uVar3 + 4);
        }
      }
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
    return;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyht_free(struct ly_ht *ht, void (*val_free)(void *val_p))
{
    struct ly_ht_rec *rec;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    if (!ht) {
        return;
    }

    if (val_free) {
        LYHT_ITER_ALL_RECS(ht, hlist_idx, rec_idx, rec) {
            val_free(&rec->val);
        }
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
}